

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_1,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_1,_2> *a,Matrix<float,_2,_2> *b)

{
  float fVar1;
  Matrix<float,_1,_2> MVar2;
  float *pfVar3;
  float extraout_XMM0_Da [1];
  float extraout_XMM0_Db [1];
  Vector<float,_1> VVar4;
  undefined4 local_34;
  undefined4 local_30;
  int ndx;
  float v;
  int col;
  int row;
  Matrix<float,_2,_2> *b_local;
  Matrix<float,_1,_2> *a_local;
  Matrix<float,_1,_2> *res;
  
  Matrix<float,_1,_2>::Matrix((Matrix<float,_1,_2> *)this);
  local_30 = (float  [1])(float  [1])extraout_XMM0_Da[0];
  VVar4.m_data[0] = (float  [1])(float  [1])extraout_XMM0_Db[0];
  for (v = 0.0; (int)v < 1; v = (float)((int)v + 1)) {
    for (ndx = 0; ndx < 2; ndx = ndx + 1) {
      local_30 = (float  [1])0.0;
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        pfVar3 = Matrix<float,_1,_2>::operator()(a,(int)v,local_34);
        fVar1 = *pfVar3;
        pfVar3 = Matrix<float,_2,_2>::operator()(b,local_34,ndx);
        local_30 = (float  [1])(fVar1 * *pfVar3 + (float)local_30);
      }
      pfVar3 = Matrix<float,_1,_2>::operator()((Matrix<float,_1,_2> *)this,(int)v,ndx);
      VVar4.m_data[0] = (float  [1])0.0;
      *pfVar3 = (float)local_30;
    }
  }
  MVar2.m_data.m_data[1].m_data[0] = VVar4.m_data[0];
  MVar2.m_data.m_data[0].m_data[0] = local_30;
  return (Matrix<float,_1,_2>)MVar2.m_data.m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}